

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryReadWithFds
          (BlockedWrite *this,void *buffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds)

{
  PromiseArena *pPVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  size_t extraout_RDX;
  undefined8 uVar6;
  byte *pbVar7;
  TransformPromiseNodeBase *this_00;
  OwnFd *pOVar8;
  undefined8 uVar9;
  PromiseArena *in_stack_00000008;
  Fault f_1;
  Fault f;
  PromiseArena *local_98;
  OwnFd local_8c;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  local_88;
  Fault local_58;
  OwnFd *local_50;
  OwnPromiseNode local_48;
  PromiseFulfiller<void> *local_40;
  size_t local_38;
  
  local_40 = (PromiseFulfiller<void> *)minBytes;
  local_38 = maxBytes;
  if (*(int *)((long)buffer + 0x40) == 2) {
    local_98 = (PromiseArena *)0x0;
    if ((in_stack_00000008 != (PromiseArena *)0x0) && (*(long *)((long)buffer + 0x50) != 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[130]>
                ((Fault *)&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x20d,FAILED,(char *)0x0,
                 "\"async pipe message was written with streams attached, but corresponding read \" \"asked for FDs, and we don\'t know how to convert here\""
                 ,(char (*) [130])
                  "async pipe message was written with streams attached, but corresponding read asked for FDs, and we don\'t know how to convert here"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_88);
    }
  }
  else if (*(int *)((long)buffer + 0x40) == 1) {
    local_98 = *(PromiseArena **)((long)buffer + 0x50);
    if (*(PromiseArena **)((long)buffer + 0x50) <= in_stack_00000008) {
      local_98 = in_stack_00000008;
    }
    local_50 = fdBuffer;
    local_48.ptr = (PromiseNode *)this;
    if (local_98 != (PromiseArena *)0x0) {
      pbVar7 = (byte *)0x0;
LAB_00492abd:
      do {
        iVar2 = dup(*(int *)(*(long *)((long)buffer + 0x48) + (long)pbVar7 * 4));
        if (iVar2 < 0) {
          iVar3 = kj::_::Debug::getOsErrorNumber(false);
          if (iVar3 == -1) goto LAB_00492abd;
        }
        else {
          iVar3 = 0;
        }
        if (iVar3 != 0) {
          local_58.exception = (Exception *)0x0;
          local_88._0_8_ = (_func_int **)0x0;
          local_88.field_1._0_8_ = 0;
          kj::_::Debug::Fault::init
                    (&local_58,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_58);
        }
        local_88.tag = *(undefined4 *)(maxFds + (long)pbVar7 * 4);
        *(int *)(maxFds + (long)pbVar7 * 4) = iVar2;
        local_8c.fd = -1;
        OwnFd::~OwnFd((OwnFd *)&local_88);
        OwnFd::~OwnFd(&local_8c);
        pbVar7 = ((PromiseArena *)pbVar7)->bytes + 1;
      } while ((PromiseArena *)pbVar7 != local_98);
    }
    maxFds = maxFds + (long)local_98 * 4;
    fdBuffer = local_50;
    this = (BlockedWrite *)local_48.ptr;
  }
  else {
    local_98 = (PromiseArena *)0x0;
  }
  local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  operator=((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
             *)((long)buffer + 0x40),
            (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
             *)&local_88);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  destroy((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
           *)&local_88);
  sVar5 = local_38;
  pOVar8 = fdBuffer;
  tryReadImpl(&local_88,(BlockedWrite *)buffer,local_40,local_38,(size_t)fdBuffer);
  uVar6 = local_88.field_1._0_8_;
  uVar9 = local_88.field_1._24_8_;
  if ((local_88.tag != 2) &&
     (local_88.field_1._8_8_ = sVar5, uVar6 = extraout_RDX, local_88.field_1._16_8_ = pOVar8,
     uVar9 = fdBuffer, local_88.tag == 1)) {
    uVar6 = local_88.field_1._0_8_;
  }
  if (local_88.tag == 1) {
    local_88.field_1._0_8_ = local_98;
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>,kj::_::PromiseDisposer,kj::AsyncCapabilityStream::ReadResult>
              ((PromiseDisposer *)&local_58,(ReadResult *)&local_88);
    *(Exception **)this = local_58.exception;
  }
  else {
    if (local_88.tag != 2) {
      kj::_::unreachable();
    }
    AsyncPipe::tryReadWithFds
              ((AsyncPipe *)&local_88,*(void **)((long)buffer + 0x18),uVar6,local_88.field_1._8_8_,
               (OwnFd *)local_88.field_1._16_8_,maxFds);
    uVar6 = local_88._0_8_;
    pPVar1 = *(PromiseArena **)(local_88._0_8_ + 8);
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_88._0_8_ - (long)pPVar1) < 0x30) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_88,
                 kj::_::
                 SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:542:21)>
                 ::anon_class_16_2_23ff280d_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_0070b440;
      *(undefined8 *)((long)pvVar4 + 0x3f0) = uVar9;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = local_98;
      *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
    }
    else {
      *(PromiseArena **)(local_88._0_8_ + 8) = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_88._0_8_ + -0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_88,
                 kj::_::
                 SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:542:21)>
                 ::anon_class_16_2_23ff280d_for_func::operator());
      ((PromiseArenaMember *)(uVar6 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0070b440;
      ((PromiseArenaMember *)(uVar6 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)uVar9;
      *(PromiseArena **)(uVar6 + -8) = local_98;
      *(PromiseArena **)(uVar6 + -0x28) = pPVar1;
    }
    uVar6 = local_88._0_8_;
    *(TransformPromiseNodeBase **)this = this_00;
    if ((PromiseArenaMember *)local_88._0_8_ != (PromiseArenaMember *)0x0) {
      local_88._0_8_ = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar6);
    }
  }
  return (Promise<kj::AsyncCapabilityStream::ReadResult>)(PromiseNode *)this;
}

Assistant:

Promise<ReadResult> tryReadWithFds(void* buffer, size_t minBytes, size_t maxBytes,
                                       OwnFd* fdBuffer, size_t maxFds) override {
      size_t capCount = 0;
      {  // TODO(cleanup): Remove redundant braces when we update to C++17.
        KJ_SWITCH_ONEOF(capBuffer) {
          KJ_CASE_ONEOF(fds, ArrayPtr<const int>) {
            capCount = kj::max(fds.size(), maxFds);
            // Unfortunately, we have to dup() each FD, because the writer doesn't release ownership
            // by default.
            // TODO(perf): Should we add an ownership-releasing version of writeWithFds()?
            for (auto i: kj::zeroTo(capCount)) {
              fdBuffer[i] = KJ_SYSCALL_FD(dup(fds[i]));
            }
            fdBuffer += capCount;
            maxFds -= capCount;
          }
          KJ_CASE_ONEOF(streams, Array<Own<AsyncCapabilityStream>>) {
            if (streams.size() > 0 && maxFds > 0) {
              // TODO(someday): We could let people pass a LowLevelAsyncIoProvider to
              //   newTwoWayPipe() if we wanted to auto-wrap FDs, but does anyone care?
              KJ_FAIL_REQUIRE(
                  "async pipe message was written with streams attached, but corresponding read "
                  "asked for FDs, and we don't know how to convert here");
            }
          }
        }
      }

      // Drop any unclaimed caps. This mirrors the behavior of unix sockets, where if we didn't
      // provide enough buffer space for all the written FDs, the remaining ones are lost.
      capBuffer = {};

      KJ_SWITCH_ONEOF(tryReadImpl(buffer, minBytes, maxBytes)) {
        KJ_CASE_ONEOF(done, Done) {
          return ReadResult { done.result, capCount };
        }
        KJ_CASE_ONEOF(retry, Retry) {
          return pipe.tryReadWithFds(
              retry.buffer, retry.minBytes, retry.maxBytes, fdBuffer, maxFds)
              .then([byteCount = retry.alreadyRead, capCount](ReadResult result) {
            result.byteCount += byteCount;
            result.capCount += capCount;
            return result;
          });
        }
      }
      KJ_UNREACHABLE;
    }